

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int gmatch(lua_State *L)

{
  char *s_00;
  char *p_00;
  lua_Integer pos;
  size_t sVar1;
  undefined8 *puVar2;
  GMatchState *gm;
  size_t init;
  char *p;
  char *s;
  size_t lp;
  size_t ls;
  lua_State *L_local;
  
  ls = (size_t)L;
  s_00 = luaL_checklstring(L,1,&lp);
  p_00 = luaL_checklstring((lua_State *)ls,2,(size_t *)&s);
  pos = luaL_optinteger((lua_State *)ls,3,1);
  sVar1 = posrelatI(pos,lp);
  gm = (GMatchState *)(sVar1 - 1);
  lua_settop((lua_State *)ls,2);
  puVar2 = (undefined8 *)lua_newuserdatauv((lua_State *)ls,0x240,0);
  if (lp < gm) {
    gm = (GMatchState *)(lp + 1);
  }
  prepstate((MatchState *)(puVar2 + 3),(lua_State *)ls,s_00,lp,p_00,(size_t)s);
  *puVar2 = s_00 + (long)gm;
  puVar2[1] = p_00;
  puVar2[2] = 0;
  lua_pushcclosure((lua_State *)ls,gmatch_aux,3);
  return 1;
}

Assistant:

static int gmatch (lua_State *L) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  GMatchState *gm;
  lua_settop(L, 2);  /* keep strings on closure to avoid being collected */
  gm = (GMatchState *)lua_newuserdatauv(L, sizeof(GMatchState), 0);
  if (init > ls)  /* start after string's end? */
    init = ls + 1;  /* avoid overflows in 's + init' */
  prepstate(&gm->ms, L, s, ls, p, lp);
  gm->src = s + init; gm->p = p; gm->lastmatch = NULL;
  lua_pushcclosure(L, gmatch_aux, 3);
  return 1;
}